

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  undefined8 *puVar16;
  stbi_uc *psVar17;
  byte bVar18;
  stbi_uc sVar19;
  uint uVar20;
  undefined4 in_register_0000000c;
  ulong uVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint n;
  byte bVar27;
  uint uVar28;
  size_t __size;
  size_t __size_00;
  char *local_70;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar7 = stbi__gif_header(s,g,comp,0);
    if (iVar7 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar7 = g->w;
    iVar8 = g->h;
    iVar9 = stbi__mad3sizes_valid(4,iVar7,iVar8,0);
    if (iVar9 == 0) {
      local_70 = "too large";
      goto LAB_0011e249;
    }
    iVar8 = iVar8 * iVar7;
    __size = (size_t)(iVar8 * 4);
    psVar13 = (stbi_uc *)malloc(__size);
    g->out = psVar13;
    psVar14 = (stbi_uc *)malloc(__size);
    g->background = psVar14;
    __size_00 = (size_t)iVar8;
    psVar15 = (stbi_uc *)malloc(__size_00);
    g->history = psVar15;
    local_70 = "outofmem";
    if ((psVar13 == (stbi_uc *)0x0) || (psVar15 == (stbi_uc *)0x0 || psVar14 == (stbi_uc *)0x0))
    goto LAB_0011e249;
    memset(psVar13,0,__size);
    memset(psVar14,0,__size);
    memset(psVar15,0,__size_00);
  }
  else {
    uVar26 = (uint)g->eflags >> 2 & 7;
    uVar6 = g->h * g->w;
    uVar20 = 2;
    if (uVar26 != 3) {
      uVar20 = uVar26;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar20 = uVar26;
    }
    if (uVar20 == 3) {
      if (0 < (int)uVar6) {
        uVar21 = 0;
        do {
          if (g->history[uVar21] != '\0') {
            *(undefined4 *)(g->out + uVar21 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar21 * 4);
          }
          uVar21 = uVar21 + 1;
        } while (uVar6 != uVar21);
      }
    }
    else if ((uVar20 == 2) && (0 < (int)uVar6)) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] != '\0') {
          *(undefined4 *)(g->out + uVar21 * 4) = *(undefined4 *)(g->background + uVar21 * 4);
        }
        uVar21 = uVar21 + 1;
      } while (uVar6 != uVar21);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar15 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar15,0,__size_00);
  psVar15 = s->buffer_start;
  psVar13 = s->buffer_start + 1;
  local_70 = "unknown code";
LAB_0011de57:
  pbVar2 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  if (pbVar2 < psVar14) {
    s->img_buffer = pbVar2 + 1;
    bVar5 = *pbVar2;
    psVar17 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0011e249;
    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar7 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
      psVar14 = psVar13;
    }
    else {
      bVar5 = *psVar15;
      psVar14 = psVar15 + iVar7;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar13;
    psVar17 = psVar13;
  }
  if (bVar5 == 0x21) {
    if (psVar17 < psVar14) {
      s->img_buffer = psVar17 + 1;
      bVar5 = *psVar17;
      psVar17 = psVar17 + 1;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_0011e0ee;
      iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
      if (iVar7 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar5 = 0;
        psVar14 = psVar13;
      }
      else {
        bVar5 = *psVar15;
        psVar14 = psVar15 + iVar7;
      }
      s->img_buffer_end = psVar14;
      s->img_buffer = psVar13;
      psVar17 = psVar13;
    }
    if (bVar5 != 0xf9) goto LAB_0011e0ee;
    if (psVar17 < psVar14) {
      s->img_buffer = psVar17 + 1;
      bVar5 = *psVar17;
      psVar17 = psVar17 + 1;
LAB_0011df85:
      if (bVar5 == 4) {
        if (psVar17 < psVar14) {
          s->img_buffer = psVar17 + 1;
          bVar5 = *psVar17;
        }
        else if (s->read_from_callbacks == 0) {
          bVar5 = 0;
        }
        else {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar5 = 0;
            psVar14 = psVar13;
          }
          else {
            bVar5 = *psVar15;
            psVar14 = psVar15 + iVar7;
          }
          s->img_buffer_end = psVar14;
          s->img_buffer = psVar13;
        }
        g->eflags = (uint)bVar5;
        iVar7 = stbi__get16le(s);
        g->delay = iVar7 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          pbVar2 = s->img_buffer;
          if (pbVar2 < s->img_buffer_end) {
            s->img_buffer = pbVar2 + 1;
            bVar5 = *pbVar2;
          }
          else if (s->read_from_callbacks == 0) {
            bVar5 = 0;
          }
          else {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar5 = 0;
              psVar14 = psVar13;
            }
            else {
              bVar5 = *psVar15;
              psVar14 = psVar15 + iVar7;
            }
            s->img_buffer_end = psVar14;
            s->img_buffer = psVar13;
          }
          g->transparent = (uint)bVar5;
          g->pal[bVar5][3] = '\0';
          goto LAB_0011e0ee;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar14 = s->img_buffer;
LAB_0011e09e:
          s->img_buffer = psVar14 + 1;
        }
        else {
          psVar14 = s->img_buffer;
          iVar7 = (int)s->img_buffer_end - (int)psVar14;
          if (0 < iVar7) goto LAB_0011e09e;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar7);
        }
        g->transparent = -1;
LAB_0011e0ee:
        do {
          pbVar2 = s->img_buffer;
          if (pbVar2 < s->img_buffer_end) {
            s->img_buffer = pbVar2 + 1;
            bVar5 = *pbVar2;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0011de57;
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar5 = 0;
              psVar14 = psVar13;
            }
            else {
              bVar5 = *psVar15;
              psVar14 = psVar15 + iVar7;
            }
            s->img_buffer_end = psVar14;
            s->img_buffer = psVar13;
          }
          if (bVar5 == 0) goto LAB_0011de57;
          stbi__skip(s,(uint)bVar5);
        } while( true );
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar5 = 0;
          psVar14 = psVar13;
        }
        else {
          bVar5 = *psVar15;
          psVar14 = psVar15 + iVar7;
        }
        s->img_buffer_end = psVar14;
        s->img_buffer = psVar13;
        psVar17 = psVar13;
        goto LAB_0011df85;
      }
      bVar5 = 0;
    }
    stbi__skip(s,(uint)bVar5);
    goto LAB_0011de57;
  }
  if (bVar5 == 0x3b) {
    return (stbi_uc *)s;
  }
  if (bVar5 != 0x2c) goto LAB_0011e249;
  iVar7 = stbi__get16le(s);
  iVar8 = stbi__get16le(s);
  iVar9 = stbi__get16le(s);
  iVar10 = stbi__get16le(s);
  local_70 = "bad Image Descriptor";
  if ((g->w < iVar9 + iVar7) || (g->h < iVar10 + iVar8)) goto LAB_0011e249;
  iVar23 = g->w * 4;
  g->line_size = iVar23;
  g->start_x = iVar7 << 2;
  g->start_y = iVar8 * iVar23;
  g->max_x = (iVar9 + iVar7) * 4;
  iVar10 = (iVar10 + iVar8) * iVar23;
  g->max_y = iVar10;
  g->cur_x = iVar7 << 2;
  if (iVar9 != 0) {
    iVar10 = iVar8 * iVar23;
  }
  g->cur_y = iVar10;
  psVar14 = s->img_buffer;
  psVar17 = s->img_buffer_end;
  if (psVar14 < psVar17) {
    s->img_buffer = psVar14 + 1;
    bVar5 = *psVar14;
    psVar14 = psVar14 + 1;
LAB_0011e2d4:
    uVar20 = (uint)bVar5;
    g->lflags = uVar20;
    iVar7 = iVar23 * 8;
    if ((bVar5 & 0x40) == 0) {
      iVar7 = iVar23;
    }
    iVar23 = iVar7;
    uVar6 = (int)(uVar20 << 0x19) >> 0x1f & 3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
      if (iVar7 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar5 = 0;
        psVar17 = psVar13;
      }
      else {
        bVar5 = *psVar15;
        psVar17 = psVar15 + iVar7;
      }
      s->img_buffer_end = psVar17;
      s->img_buffer = psVar13;
      iVar23 = g->line_size;
      psVar14 = psVar13;
      goto LAB_0011e2d4;
    }
    g->lflags = 0;
    uVar6 = 0;
    uVar20 = 0;
  }
  g->step = iVar23;
  g->parse = uVar6;
  if (uVar20 < 0x80) {
    if ((g->flags & 0x80) == 0) {
      local_70 = "missing color table";
LAB_0011e249:
      puVar16 = (undefined8 *)__tls_get_addr(&PTR_0012de18);
      *puVar16 = local_70;
      return (stbi_uc *)0x0;
    }
    g->color_table = g->pal[0];
  }
  else {
    iVar7 = -1;
    if ((g->eflags & 1) != 0) {
      iVar7 = g->transparent;
    }
    stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)uVar20 & 7),iVar7);
    g->color_table = g->lpal[0];
    psVar14 = s->img_buffer;
    psVar17 = s->img_buffer_end;
  }
  if (psVar14 < psVar17) {
    s->img_buffer = psVar14 + 1;
    bVar5 = *psVar14;
  }
  else {
    if (s->read_from_callbacks == 0) {
      bVar5 = 0;
      goto LAB_0011e3ce;
    }
    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar7 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
      psVar14 = psVar13;
    }
    else {
      bVar5 = *psVar15;
      psVar14 = psVar15 + iVar7;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar13;
  }
  if (0xc < bVar5) {
    return (stbi_uc *)0x0;
  }
LAB_0011e3ce:
  uVar20 = 1 << (bVar5 & 0x1f);
  uVar21 = 0;
  do {
    g->codes[uVar21].prefix = -1;
    g->codes[uVar21].first = (stbi_uc)uVar21;
    g->codes[uVar21].suffix = (stbi_uc)uVar21;
    uVar21 = uVar21 + 1;
  } while (uVar20 != uVar21);
  uVar11 = (2 << (bVar5 & 0x1f)) - 1;
  n = 0;
  iVar7 = 0;
  uVar6 = 0;
  bVar22 = 0;
  uVar26 = uVar20 + 2;
  uVar3 = 0xffffffff;
  iVar8 = bVar5 + 1;
  uVar4 = uVar11;
LAB_0011e44d:
  do {
    for (; uVar12 = uVar4, iVar9 = iVar8, uVar24 = uVar3, uVar25 = uVar26, bVar27 = bVar22,
        iVar8 = iVar7 - iVar9, iVar7 < iVar9; iVar7 = iVar7 + 8) {
      psVar14 = s->img_buffer;
      psVar17 = s->img_buffer_end;
      if (n == 0) {
        if (psVar14 < psVar17) {
          s->img_buffer = psVar14 + 1;
          bVar22 = *psVar14;
          psVar14 = psVar14 + 1;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_0011e709;
          iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
          if (iVar8 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar22 = 0;
            psVar17 = psVar13;
          }
          else {
            bVar22 = *psVar15;
            psVar17 = psVar15 + iVar8;
          }
          s->img_buffer_end = psVar17;
          s->img_buffer = psVar13;
          psVar14 = psVar13;
        }
        if (bVar22 == 0) goto LAB_0011e709;
        n = (uint)bVar22;
      }
      if (psVar14 < psVar17) {
        s->img_buffer = psVar14 + 1;
        bVar22 = *psVar14;
      }
      else if (s->read_from_callbacks == 0) {
        bVar22 = 0;
      }
      else {
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar22 = 0;
          psVar14 = psVar13;
        }
        else {
          bVar22 = *psVar15;
          psVar14 = psVar15 + iVar8;
        }
        s->img_buffer_end = psVar14;
        s->img_buffer = psVar13;
      }
      bVar18 = (byte)iVar7;
      n = n - 1;
      uVar6 = uVar6 | (uint)bVar22 << (bVar18 & 0x1f);
      bVar22 = bVar27;
      uVar26 = uVar25;
      uVar3 = uVar24;
      iVar8 = iVar9;
      uVar4 = uVar12;
    }
    uVar26 = (int)uVar6 >> ((byte)iVar9 & 0x1f);
    uVar28 = uVar6 & uVar12;
    iVar7 = iVar8;
    uVar6 = uVar26;
    bVar22 = 1;
    uVar26 = uVar20 + 2;
    uVar3 = 0xffffffff;
    iVar8 = bVar5 + 1;
    uVar4 = uVar11;
  } while (uVar28 == uVar20);
  if (uVar28 == uVar20 + 1) goto LAB_0011e699;
  local_70 = "no clear code";
  if ((int)uVar25 < (int)uVar28) {
    local_70 = "illegal code in raster";
    goto LAB_0011e249;
  }
  if ((bool)(bVar27 ^ 1)) goto LAB_0011e249;
  if ((int)uVar24 < 0) {
    if (uVar28 == uVar25) goto LAB_0011e783;
  }
  else {
    if (0x1fff < (int)uVar25) {
      local_70 = "too many codes";
      goto LAB_0011e249;
    }
    g->codes[(int)uVar25].prefix = (stbi__int16)uVar24;
    sVar19 = g->codes[uVar24].first;
    g->codes[(int)uVar25].first = sVar19;
    if (uVar28 != uVar25 + 1) {
      sVar19 = g->codes[(int)uVar28].first;
    }
    g->codes[(int)uVar25].suffix = sVar19;
    uVar25 = uVar25 + 1;
  }
  stbi__out_gif_code(g,(stbi__uint16)uVar28);
  bVar22 = 1;
  uVar26 = uVar25;
  uVar3 = uVar28;
  iVar8 = iVar9 + 1;
  uVar4 = ~(-1 << ((byte)(iVar9 + 1) & 0x1f));
  if ((uVar25 & uVar12) != 0 || 0xfff < (int)uVar25) {
    iVar8 = iVar9;
    uVar4 = uVar12;
  }
  goto LAB_0011e44d;
LAB_0011e699:
  stbi__skip(s,n);
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
    s->img_buffer = pbVar2 + 1;
    bVar5 = *pbVar2;
  }
  else {
    if (s->read_from_callbacks == 0) {
LAB_0011e709:
      psVar15 = g->out;
      if (psVar15 == (stbi_uc *)0x0) {
        return (stbi_uc *)0x0;
      }
      if (psVar1 == (stbi_uc *)0x0) {
        uVar20 = g->h * g->w;
        if (0 < (int)uVar20 && 0 < g->bgindex) {
          uVar21 = 0;
          do {
            if (g->history[uVar21] == '\0') {
              g->pal[g->bgindex][3] = 0xff;
              *(stbi_uc (*) [4])(g->out + uVar21 * 4) = g->pal[g->bgindex];
            }
            uVar21 = uVar21 + 1;
          } while (uVar20 != uVar21);
          return psVar15;
        }
        return psVar15;
      }
      return psVar15;
    }
    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar7 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
      psVar14 = psVar13;
    }
    else {
      bVar5 = *psVar15;
      psVar14 = psVar15 + iVar7;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar13;
  }
  if (bVar5 == 0) goto LAB_0011e709;
  n = (uint)bVar5;
  goto LAB_0011e699;
LAB_0011e783:
  local_70 = "illegal code in raster";
  goto LAB_0011e249;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}